

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O2

ostream * subsat::operator<<(ostream *os,ConstraintRef cr)

{
  std::operator<<(os,"ConstraintRef{");
  if (cr.m_index == 0xffffffff) {
    std::operator<<(os,"-");
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::operator<<(os,"}");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ConstraintRef cr)
{
  os << "ConstraintRef{";
  if (cr.is_valid()) {
    os << cr.index();
  } else {
    os << "-";
  }
  os << "}";
  return os;
}